

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O3

int __thiscall prometheus::Gateway::push(Gateway *this,HttpMethod method)

{
  pointer ppVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  int iVar3;
  _Atomic_word _Var4;
  undefined8 uVar5;
  pointer collectable;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R14;
  bool bVar6;
  string body;
  string uri;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  pthread_mutex_t *local_a8;
  Serializer local_90;
  string local_88;
  string local_68;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_48;
  
  local_90._vptr_Serializer = (_func_int **)&PTR__Serializer_00123cf8;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar3 != 0) {
    uVar5 = ::std::__throw_system_error(iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R14);
    pthread_mutex_unlock(local_a8);
    _Unwind_Resume(uVar5);
  }
  collectable = (this->collectables_).
                super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->collectables_).
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 200;
  if (collectable != ppVar1) {
    do {
      this_00 = (collectable->first).
                super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var4 = this_00->_M_use_count;
        do {
          if (_Var4 == 0) goto LAB_001076db;
          LOCK();
          iVar3 = this_00->_M_use_count;
          bVar6 = _Var4 == iVar3;
          if (bVar6) {
            this_00->_M_use_count = _Var4 + 1;
            iVar3 = _Var4;
          }
          _Var4 = iVar3;
          UNLOCK();
        } while (!bVar6);
        peVar2 = (collectable->first).
                 super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 == (element_type *)0x0 || this_00->_M_use_count == 0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        else {
          (*peVar2->_vptr_Collectable[2])(&local_48);
          Serializer::Serialize_abi_cxx11_(&local_88,&local_90,&local_48);
          getUri(&local_68,this,collectable);
          iVar3 = detail::CurlWrapper::performHttpRequest
                            ((this->curlWrapper_)._M_t.
                             super___uniq_ptr_impl<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_prometheus::detail::CurlWrapper_*,_std::default_delete<prometheus::detail::CurlWrapper>_>
                             .super__Head_base<0UL,_prometheus::detail::CurlWrapper_*,_false>.
                             _M_head_impl,method,&local_68,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::
          ~vector(&local_48);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          if (299 < iVar3 - 100U) goto LAB_001076f2;
        }
      }
LAB_001076db:
      collectable = collectable + 1;
    } while (collectable != ppVar1);
    iVar3 = 200;
  }
LAB_001076f2:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return iVar3;
}

Assistant:

int Gateway::push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = serializer.Serialize(metrics);
    auto uri = getUri(wcollectable);
    auto status_code = curlWrapper_->performHttpRequest(method, uri, body);

    if (status_code < 100 || status_code >= 400) {
      return status_code;
    }
  }

  return 200;
}